

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  enet_uint32 eVar7;
  uint uVar8;
  enet_uint32 eVar9;
  _ENetListNode *p_Var10;
  ENetListIterator position;
  _ENetListNode *p_Var11;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var12;
  ENetChecksumCallback p_Var13;
  size_t sVar14;
  ENetPacket *packet;
  ENetEvent *pEVar15;
  ushort uVar16;
  int iVar17;
  enet_uint32 eVar18;
  ENetPeer *pEVar19;
  void *pvVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  size_t sVar24;
  long lVar25;
  ENetListIterator pEVar26;
  ulong uVar27;
  ENetPeer *peer;
  enet_uint8 headerData [8];
  undefined4 local_64;
  int local_5c;
  ENetEvent *local_58;
  enet_uint8 (*local_50) [4096];
  ENetBuffer *local_48;
  ENetBuffer *local_40;
  _ENetListNode *local_38;
  
  local_48 = host->buffers;
  local_40 = host->buffers + 1;
  local_50 = host->packetData + 1;
  pEVar19 = host->peers;
  sVar24 = host->peerCount;
  local_5c = checkForTimeouts;
  local_58 = event;
  do {
    host->continueSending = 0;
    peer = pEVar19;
    if ((long)sVar24 < 1) {
      return 0;
    }
    do {
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 4;
        local_38 = &(peer->acknowledgements).sentinel;
        pEVar26 = (peer->acknowledgements).sentinel.next;
        if (pEVar26 != local_38) {
          lVar25 = 0x688;
          uVar27 = 0x6a;
          do {
            if (0x669 < uVar27) {
              lVar25 = 0x888;
              uVar27 = 0x66a;
LAB_0015fe95:
              host->continueSending = 1;
              break;
            }
            sVar24 = host->packetSize;
            if (peer->mtu - sVar24 < 8) goto LAB_0015fe95;
            p_Var10 = pEVar26->next;
            *(ulong *)((long)host->commands + lVar25 + -0x6a) =
                 (long)host->commands + (uVar27 - 0x6a);
            *(undefined8 *)((long)host->commands + lVar25 + -0x62) = 8;
            host->packetSize = sVar24 + 8;
            uVar16 = *(ushort *)((long)&pEVar26[1].next + 6);
            uVar16 = uVar16 << 8 | uVar16 >> 8;
            *(undefined1 *)((long)host->commands + (uVar27 - 0x6a)) = 1;
            *(undefined1 *)((long)host->commands + (uVar27 - 0x69)) =
                 *(undefined1 *)((long)&pEVar26[1].next + 5);
            *(ushort *)((long)host->commands + (uVar27 - 0x68)) = uVar16;
            *(ushort *)((long)host->commands + (uVar27 - 0x66)) = uVar16;
            *(ushort *)((long)host->commands + (uVar27 - 100)) =
                 *(ushort *)&pEVar26[1].next << 8 | *(ushort *)&pEVar26[1].next >> 8;
            if (((ulong)pEVar26[1].next & 0xf00000000) == 0x400000000) {
              enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
            }
            enet_list_remove(pEVar26);
            enet_free(pEVar26);
            uVar27 = uVar27 + 0x30;
            lVar25 = lVar25 + 0x10;
            pEVar26 = p_Var10;
          } while (p_Var10 != local_38);
          host->commandCount = (long)(short)(((short)((short)uVar27 + -0x6a) >> 4) * -0x5555);
          host->bufferCount = lVar25 + -0x678 >> 4;
        }
        if (local_5c != 0) {
          pEVar2 = &peer->sentReliableCommands;
          pEVar26 = (peer->sentReliableCommands).sentinel.next;
          if ((pEVar26 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000))
          {
            position = (peer->outgoingCommands).sentinel.next;
            do {
              pEVar15 = local_58;
              p_Var10 = pEVar26->next;
              eVar18 = host->serviceTime;
              eVar7 = *(enet_uint32 *)((long)&pEVar26[1].next + 4);
              uVar23 = eVar18 - eVar7;
              uVar21 = eVar7 - eVar18;
              uVar22 = uVar23;
              if (86399999 < uVar23) {
                uVar22 = uVar21;
              }
              uVar8 = *(uint *)&pEVar26[1].previous;
              if (uVar8 <= uVar22) {
                eVar9 = peer->earliestTimeout;
                if ((eVar9 == 0) || (86399999 < eVar7 - eVar9)) {
                  peer->earliestTimeout = eVar7;
                  if (eVar7 != 0) goto LAB_0015ff67;
                }
                else {
                  uVar23 = eVar18 - eVar9;
                  uVar21 = eVar9 - eVar18;
LAB_0015ff67:
                  if (uVar23 < 86400000) {
                    uVar21 = uVar23;
                  }
                  if ((peer->timeoutMaximum <= uVar21) ||
                     ((*(uint *)((long)&pEVar26[1].previous + 4) <= uVar8 &&
                      (peer->timeoutMinimum <= uVar21)))) {
                    enet_protocol_notify_disconnect(host,peer,local_58);
                    if ((pEVar15 != (ENetEvent *)0x0) && (local_58->type != ENET_EVENT_TYPE_NONE)) {
                      return 1;
                    }
                    goto LAB_001602dd;
                  }
                }
                if (pEVar26[5].previous != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit - (uint)*(ushort *)((long)&pEVar26[2].next + 4);
                }
                peer->packetsLost = peer->packetsLost + 1;
                *(uint *)&pEVar26[1].previous = uVar8 * 2;
                pvVar20 = enet_list_remove(pEVar26);
                enet_list_insert(position,pvVar20);
                p_Var11 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var11 != &pEVar2->sentinel && p_Var10 == p_Var11) {
                  peer->nextTimeout =
                       *(int *)&p_Var10[1].previous + *(int *)((long)&p_Var10[1].next + 4);
                }
              }
              pEVar26 = p_Var10;
            } while (p_Var10 != &pEVar2->sentinel);
          }
        }
        pEVar2 = &peer->outgoingCommands;
        if ((((peer->outgoingCommands).sentinel.next == &pEVar2->sentinel) ||
            (iVar17 = enet_protocol_check_outgoing_commands(host,peer), iVar17 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar21 = host->serviceTime - peer->lastReceiveTime;
          uVar22 = peer->lastReceiveTime - host->serviceTime;
          if (uVar21 < 86400000) {
            uVar22 = uVar21;
          }
          if ((peer->pingInterval <= uVar22) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_check_outgoing_commands(host,peer);
          }
        }
        if (host->commandCount != 0) {
          eVar18 = peer->packetLossEpoch;
          eVar7 = host->serviceTime;
          if (eVar18 == 0) {
            peer->packetLossEpoch = eVar7;
          }
          else {
            uVar22 = eVar18 - eVar7;
            if (eVar7 - eVar18 < 86400000) {
              uVar22 = eVar7 - eVar18;
            }
            if ((9999 < uVar22) && (peer->packetsSent != 0)) {
              uVar22 = peer->packetLoss;
              uVar21 = (peer->packetsLost << 0x10) / peer->packetsSent;
              iVar17 = uVar21 - uVar22;
              if (uVar21 < uVar22) {
                iVar17 = -(uVar21 - uVar22);
              }
              peer->packetLossVariance = iVar17 + peer->packetLossVariance * 3 >> 2;
              peer->packetLoss = uVar22 * 7 + uVar21 >> 3;
              peer->packetLossEpoch = eVar7;
              peer->packetsSent = 0;
              peer->packetsLost = 0;
            }
          }
          host->buffers[0].data = &local_64;
          uVar16 = host->headerFlags;
          sVar24 = 2;
          if ((short)uVar16 < 0) {
            local_64._2_2_ = (ushort)eVar7 << 8 | (ushort)eVar7 >> 8;
            sVar24 = 4;
          }
          host->buffers[0].dataLength = sVar24;
          pvVar20 = (host->compressor).context;
          if ((pvVar20 == (void *)0x0) ||
             (p_Var12 = (host->compressor).compress,
             p_Var12 ==
             (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
LAB_00160188:
            sVar24 = 0;
          }
          else {
            uVar27 = host->packetSize - 4;
            sVar24 = (*p_Var12)(pvVar20,local_40,host->bufferCount - 1,uVar27,*local_50,uVar27);
            uVar16 = host->headerFlags;
            if (uVar27 <= sVar24 || sVar24 == 0) goto LAB_00160188;
            uVar16 = uVar16 | 0x4000;
            host->headerFlags = uVar16;
          }
          uVar6 = peer->outgoingPeerID;
          if (uVar6 < 0xfff) {
            iVar17._0_1_ = peer->outgoingSessionID;
            iVar17._1_1_ = peer->incomingSessionID;
            iVar17._2_2_ = *(undefined2 *)&peer->field_0x22;
            uVar16 = uVar16 | (ushort)(iVar17 << 0xc);
            host->headerFlags = uVar16;
          }
          local_64._0_2_ = (uVar16 | uVar6) << 8 | (uVar16 | uVar6) >> 8;
          p_Var13 = host->checksum;
          if (p_Var13 != (ENetChecksumCallback)0x0) {
            eVar18 = 0;
            if (uVar6 < 0xfff) {
              eVar18 = peer->connectID;
            }
            sVar14 = host->buffers[0].dataLength;
            *(enet_uint32 *)((long)&local_64 + sVar14) = eVar18;
            host->buffers[0].dataLength = sVar14 + 4;
            eVar18 = (*p_Var13)(local_48,host->bufferCount);
            *(enet_uint32 *)((long)&local_64 + sVar14) = eVar18;
          }
          if (sVar24 == 0) {
            sVar24 = host->bufferCount;
          }
          else {
            host->buffers[1].data = local_50;
            host->buffers[1].dataLength = sVar24;
            host->bufferCount = 2;
            sVar24 = 2;
          }
          peer->lastSendTime = host->serviceTime;
          iVar17 = enet_socket_send(host->socket,&peer->address,local_48,sVar24);
          pEVar3 = &peer->sentUnreliableCommands;
          pEVar26 = (peer->sentUnreliableCommands).sentinel.next;
          if (pEVar26 != &pEVar3->sentinel) {
            do {
              enet_list_remove(pEVar26);
              packet = (ENetPacket *)pEVar26[5].previous;
              if ((packet != (ENetPacket *)0x0) &&
                 (packet->referenceCount = packet->referenceCount - 1, packet->referenceCount == 0))
              {
                pbVar1 = (byte *)((long)&packet->flags + 1);
                *pbVar1 = *pbVar1 | 1;
                enet_packet_destroy(packet);
              }
              enet_free(pEVar26);
              pEVar26 = (pEVar3->sentinel).next;
            } while (pEVar26 != &pEVar3->sentinel);
            if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                ((pEVar2->sentinel).next == &pEVar2->sentinel)) &&
               ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel
               )) {
              enet_peer_disconnect(peer,peer->eventData);
            }
          }
          if (iVar17 < 0) {
            return -1;
          }
          uVar4 = host->totalSentData;
          uVar5 = host->totalSentPackets;
          host->totalSentData = iVar17 + uVar4;
          host->totalSentPackets = uVar5 + 1;
        }
      }
LAB_001602dd:
      peer = peer + 1;
      pEVar19 = host->peers;
      sVar24 = host->peerCount;
    } while (peer < pEVar19 + sVar24);
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
 
    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
           currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingCommands) ||
              enet_protocol_check_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_check_outgoing_commands (host, currentPeer);
        }

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif

           currentPeer -> packetLossVariance = (currentPeer -> packetLossVariance * 3 + ENET_DIFFERENCE (packetLoss, currentPeer -> packetLoss)) / 4;
           currentPeer -> packetLoss = (currentPeer -> packetLoss * 7 + packetLoss) / 8;

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_16 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}